

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O0

SharedLiterals *
Clasp::SharedLiterals::newShareable(Literal *lits,uint32 size,ConstraintType t,uint32 numRefs)

{
  SharedLiterals *pSVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  void *m;
  uint32 size_00;
  undefined4 in_stack_ffffffffffffffe8;
  
  pSVar1 = (SharedLiterals *)Detail::alloc(0);
  size_00 = (uint32)((ulong)pSVar1 >> 0x20);
  SharedLiterals((SharedLiterals *)CONCAT44(in_ESI,in_EDX),
                 (Literal *)CONCAT44(in_ECX,in_stack_ffffffffffffffe8),size_00,
                 (ConstraintType)pSVar1,size_00);
  return pSVar1;
}

Assistant:

SharedLiterals* SharedLiterals::newShareable(const Literal* lits, uint32 size, ConstraintType t, uint32 numRefs) {
	void* m = Detail::alloc(sizeof(SharedLiterals)+(size*sizeof(Literal)));
	return new (m) SharedLiterals(lits, size, t, numRefs);
}